

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O2

void __thiscall FIX::FileStore::refresh(FileStore *this)

{
  int __oflag;
  UtcTimeStamp local_38;
  
  UtcTimeStamp::now();
  MemoryStore::reset(&this->m_cache,&local_38);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>_>
  ::clear(&(this->m_offsets)._M_t);
  open(this,(char *)0x0,__oflag);
  return;
}

Assistant:

EXCEPT(IOException) {
  try {
    m_cache.reset(UtcTimeStamp::now());
    m_offsets.clear();
    open(false);
  } catch (std::exception &e) {
    throw IOException(e.what());
  }
}